

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::keepFilesOpen(Config *this,string *parameter)

{
  bool bVar1;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  keep_files_open_set = true;
  bVar1 = std::operator==(parameter,"y");
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  keep_files_open = bVar1;
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::keepFilesOpen(std::string const& parameter)
{
    o.m->keep_files_open_set = true;
    o.m->keep_files_open = (parameter == "y");
    return this;
}